

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O1

SourceDynamicProfileManager *
Js::SourceDynamicProfileManager::LoadFromDynamicProfileStorage
          (SourceContextInfo *info,ScriptContext *scriptContext,
          SimpleDataCacheWrapper *dataCacheWrapper)

{
  Recycler *recycler;
  Type pcVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  DWORD DVar5;
  undefined4 *puVar6;
  char *buffer;
  char16 *pcVar7;
  Recycler *alloc;
  SourceDynamicProfileManager *this;
  StorageInfo *this_00;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  recycler = scriptContext->recycler;
  if ((!DynamicProfileStorage::enabled) ||
     (pcVar1 = (info->field_5).field_0.url, pcVar1 == (Type)0x0)) {
    this = (SourceDynamicProfileManager *)0x0;
    goto LAB_00b0e624;
  }
  data._32_8_ = pcVar1;
  CCLock::Enter(&DynamicProfileStorage::cs.super_CCLock);
  if (DynamicProfileStorage::useCacheDir == true) {
    bVar3 = DynamicProfileStorage::AcquireLock();
    if (bVar3) {
      DynamicProfileStorage::LoadCacheCatalog();
    }
  }
  uVar4 = JsUtil::
          BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<char16_t_const*>
                    ((BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                      *)&DynamicProfileStorage::infoMap,(char16_t **)&data.line);
  if ((int)uVar4 < 0) {
    if (DynamicProfileStorage::useCacheDir == true) {
      DynamicProfileStorage::ReleaseLock();
    }
LAB_00b0e615:
    this = (SourceDynamicProfileManager *)0x0;
  }
  else {
    this_00 = (StorageInfo *)(DynamicProfileStorage::infoMap.entries + uVar4);
    if (this_00->isFileStorage == true) {
      if (DynamicProfileStorage::useCacheDir == false) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileStorage.h"
                                    ,0x74,"(useCacheDir)","useCacheDir");
        if (!bVar3) goto LAB_00b0e697;
        *puVar6 = 0;
      }
      if (DynamicProfileStorage::locked == false) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileStorage.h"
                                    ,0x75,"(locked)","locked");
        if (!bVar3) goto LAB_00b0e697;
        *puVar6 = 0;
      }
      buffer = DynamicProfileStorage::StorageInfo::ReadRecord(this_00);
      DynamicProfileStorage::ReleaseLock();
      if (buffer == (char *)0x0) {
        bVar3 = DynamicProfileStorage::DoTrace();
        if (bVar3) {
          Output::Print(L"TRACE: DynamicProfileStorage: Failed to load from cache dir for \'%s\'",
                        data._32_8_);
          Output::Flush();
        }
        goto LAB_00b0e615;
      }
    }
    else {
      buffer = (this_00->field_1).record;
    }
    DVar5 = DynamicProfileStorage::GetRecordSize(buffer);
    if (DVar5 == 0) goto LAB_00b0e615;
    local_60 = (undefined1  [8])DynamicProfileStorage::GetRecordBuffer(buffer);
    data.typeinfo = (type_info *)(ulong)DVar5;
    this = Deserialize<Js::BufferReader>((BufferReader *)local_60,recycler);
    if (this_00->isFileStorage == true) {
      if (DynamicProfileStorage::useCacheDir == false) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileStorage.h"
                                    ,0x91,"(useCacheDir)","useCacheDir");
        if (!bVar3) goto LAB_00b0e697;
        *puVar6 = 0;
      }
      DynamicProfileStorage::DeleteRecord(buffer);
    }
    bVar3 = DynamicProfileStorage::DoTrace();
    if (bVar3 && this != (SourceDynamicProfileManager *)0x0) {
      Output::Print(L"TRACE: DynamicProfileStorage: Dynamic Profile Data Loaded: \'%s\'\n",
                    data._32_8_);
    }
    if (this == (SourceDynamicProfileManager *)0x0) {
      pcVar7 = DynamicProfileStorage::GetMessageType();
      if (pcVar7 != (char16 *)0x0) {
        Output::Print(L"%s: DynamicProfileStorage: Dynamic Profile Data corrupted: \'%s\'\n",pcVar7,
                      data._32_8_);
        Output::Flush();
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileStorage.h"
                                    ,0xa2,"(false)","false");
        if (!bVar3) {
LAB_00b0e697:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
    }
  }
  CCLock::Leave(&DynamicProfileStorage::cs.super_CCLock);
LAB_00b0e624:
  if (this == (SourceDynamicProfileManager *)0x0) {
    local_60 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_592d864;
    data.filename._0_4_ = 0x116;
    alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
    this = (SourceDynamicProfileManager *)new<Memory::Recycler>(0x98,alloc,0x38bbb2);
    SourceDynamicProfileManager(this,recycler);
  }
  return this;
}

Assistant:

SourceDynamicProfileManager *
    SourceDynamicProfileManager::LoadFromDynamicProfileStorage(SourceContextInfo* info, ScriptContext* scriptContext, SimpleDataCacheWrapper* dataCacheWrapper)
    {
        SourceDynamicProfileManager* manager = nullptr;
        Recycler* recycler = scriptContext->GetRecycler();

#ifdef DYNAMIC_PROFILE_STORAGE
        if(DynamicProfileStorage::IsEnabled() && info->url != nullptr)
        {
            manager = DynamicProfileStorage::Load(info->url, [recycler](char const * buffer, uint length) -> SourceDynamicProfileManager *
            {
                BufferReader reader(buffer, length);
                return SourceDynamicProfileManager::Deserialize(&reader, recycler);
            });
        }
#endif
        if(manager == nullptr)
        {
            manager = RecyclerNew(recycler, SourceDynamicProfileManager, recycler);
        }
        if(dataCacheWrapper != nullptr)
        {
            bool profileLoaded = manager->LoadFromProfileCache(dataCacheWrapper, info->url);
            if(profileLoaded)
            {
                JS_ETW(EventWriteJSCRIPT_PROFILE_LOAD(info->dwHostSourceContext, scriptContext));
            }
        }
        return manager;
    }